

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

int __thiscall
TPZFMatrix<long_double>::Substitution(TPZFMatrix<long_double> *this,TPZFMatrix<long_double> *B)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  longdouble *plVar4;
  longdouble *plVar5;
  bool bVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  longdouble *plVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  longdouble lVar16;
  ulong local_60;
  
  if ((this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed != '\x01') {
    Error("TPZFMatrix::Decompose_LU substitution called for a wrongly decomposed matrix",(char *)0x0
         );
  }
  uVar1 = (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  uVar2 = (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  uVar3 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  if (uVar1 != uVar3) {
    Error("SubstitutionLU <incompatible dimensions>",(char *)0x0);
  }
  if (0 < (long)uVar1) {
    uVar8 = 0;
    do {
      if (0 < (long)uVar2) {
        plVar4 = this->fElem;
        uVar10 = 0;
        do {
          if (uVar8 != 0) {
            plVar5 = B->fElem;
            lVar12 = (uVar10 & 0xffffffff) * uVar1;
            lVar16 = plVar5[lVar12 + uVar8];
            plVar11 = (longdouble *)((uVar10 & 0xffffffff) * uVar1 * 0x10 + (long)plVar5);
            uVar13 = 0;
            do {
              lVar16 = lVar16 - *plVar11 * plVar4[uVar8 + (uVar13 & 0xffffffff) * uVar3];
              plVar5[lVar12 + uVar8] = lVar16;
              uVar13 = uVar13 + 1;
              plVar11 = plVar11 + 1;
            } while (uVar8 != uVar13);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar2);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar1);
  }
  if (0 < (long)uVar2) {
    local_60 = 0;
    do {
      if (0 < (long)uVar1) {
        lVar12 = ((local_60 & 0xffffffff) * 0x10 + 0x10) * uVar1;
        lVar14 = (local_60 & 0xffffffff) * uVar1;
        lVar15 = 0;
        uVar8 = uVar1;
        do {
          uVar10 = uVar8 - 1;
          if ((long)uVar8 < (long)uVar1) {
            plVar4 = B->fElem;
            plVar5 = this->fElem;
            lVar16 = plVar4[lVar14 + uVar10];
            plVar11 = (longdouble *)((long)plVar4 + lVar12);
            lVar9 = 0;
            do {
              lVar16 = lVar16 - *plVar11 * plVar5[uVar10 + (uint)((int)uVar8 + (int)lVar9) * uVar3];
              plVar4[lVar14 + uVar10] = lVar16;
              lVar9 = lVar9 + 1;
              plVar11 = plVar11 + 1;
            } while (lVar15 != lVar9);
          }
          lVar9 = (uVar10 & 0xffffffff) * uVar3 + uVar10;
          lVar16 = this->fElem[lVar9];
          if ((ABS(lVar16) < (longdouble)1e-16) &&
             ((pcVar7 = "static::BackSub(SubstitutionLU) <Matrix is singular",
              lVar16 == (longdouble)0 ||
              (pcVar7 = 
               "static::BackSub(SubstitutionLU) <Matrix is singular even after Power Plus...",
              (longdouble)1e-12 < ABS(B->fElem[lVar14 + uVar10] - lVar16))))) {
            Error(pcVar7 + 8,(char *)0x0);
          }
          B->fElem[lVar14 + uVar10] = B->fElem[lVar14 + uVar10] / this->fElem[lVar9];
          lVar15 = lVar15 + 1;
          lVar12 = lVar12 + -0x10;
          bVar6 = 1 < (long)uVar8;
          uVar8 = uVar10;
        } while (bVar6);
      }
      local_60 = local_60 + 1;
    } while (local_60 != uVar2);
  }
  return 1;
}

Assistant:

int TPZFMatrix<TVar>::Substitution( TPZFMatrix<TVar> *B ) const {
#ifdef USING_LAPACK    
	if (this->fDecomposed != ELUPivot) {
		Error("TPZFMatrix::Decompose_LU substitution called for a wrongly decomposed matrix");
	}
#else
	if(this->fDecomposed != ELU) {
        Error("TPZFMatrix::Decompose_LU substitution called for a wrongly decomposed matrix");
    }
#endif
    int64_t rowb = B->Rows();
    int64_t colb = B->Cols();
    int64_t row = this->Rows();
    if ( rowb != this->Rows() ) Error( "SubstitutionLU <incompatible dimensions>" );
    
    
    int64_t i,j;
    for ( i = 0; i < rowb; i++ ) {
        for ( int64_t col = 0; col < colb; col++ )
            for (j = 0; j < i; j++ )
                //B->PutVal( i, col, B->GetVal(i, col) - GetVal(i, j) * B->GetVal(j, col) );
                PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col) - GETVAL(this, row, i, j) * GETVAL(B, rowb, j, col));
    }
    
    for (int64_t col=0; col<colb; col++){
        for ( i = rowb-1; i >= 0; i-- ) {
            for (j = i+1; j < rowb ; j++ )
                //B->PutVal( i, col, B->GetVal(i, col) - GetVal(i, j) * B->GetVal(j, col) );
                PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col) - GETVAL(this, row, i, j) * GETVAL(B, rowb, j, col));
            if ( IsZero( GETVAL(this, row, i, i)/*GetVal(i, i)*/ ) ) {
                if (fabs(GETVAL(this, row, i, i)/*GetVal(i, i)*/) > 0.){
                    TVar diff = GETVAL(B, rowb, i, col) - GETVAL(this, row, i, i)/*B->GetVal(i, col) - GetVal(i, i)*/;
                    if (fabs(diff) > 1e-12){
                        Error( "BackSub(SubstitutionLU) <Matrix is singular even after Power Plus..." );
                    }
                }else  Error( "BackSub(SubstitutionLU) <Matrix is singular" );
            }
            PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col)/GETVAL(this, row, i, i));
            //B->PutVal( i, col, B->GetVal( i, col) / GetVal(i, i) );
        }
    }
    return( 1 );
    
}